

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void assign(gen_ctx_t gen_ctx)

{
  MIR_func_t func_00;
  bitmap_t bm_00;
  const_bitmap_t bm_01;
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  MIR_reg_t MVar5;
  const_bitmap_t src;
  reg_info_t *prVar6;
  char *pcVar7;
  size_t sVar8;
  bitmap_t pVVar9;
  allocno_info_t *__base;
  bitmap_t *ppVVar10;
  bitmap_t *ppVVar11;
  live_range_t_conflict start_lr_00;
  size_t sVar12;
  bool bVar13;
  bool bVar14;
  allocno_info_t aVar15;
  lr_gap_t lVar16;
  ulong in_stack_fffffffffffffea8;
  MIR_reg_t hr;
  MIR_reg_t curr_hr;
  lr_bb_t_conflict lr_bb;
  lr_gap_t lr_gap;
  int hard_reg;
  char *hard_reg_name;
  uint local_d0;
  int local_c0;
  int local_bc;
  int n_1;
  int n;
  bitmap_t spill_lr_starts;
  bitmap_t conflict_locs;
  char *pcStack_a0;
  int simplified_p;
  char *msg;
  bitmap_t global_hard_regs;
  MIR_func_t func;
  allocno_info_t allocno_info;
  bitmap_t *busy_used_locs_addr;
  bitmap_t *used_locs_addr;
  size_t length;
  bitmap_t bm;
  live_range_t_conflict lr;
  live_range_t_conflict start_lr;
  int nregs;
  int reserve_p;
  int simple_loc_update_p;
  int k;
  int j;
  int slots_num;
  MIR_type_t type;
  MIR_reg_t max_var;
  MIR_reg_t var;
  MIR_reg_t reg;
  MIR_reg_t i;
  MIR_reg_t best_loc;
  MIR_context_t ctx;
  gen_ctx_t gen_ctx_local;
  
  _i = gen_ctx->ctx;
  ctx = (MIR_context_t)gen_ctx;
  slots_num = get_max_var(gen_ctx);
  func_00 = *(MIR_func_t *)(ctx->error_func + 0x40);
  src = (const_bitmap_t)
        _MIR_get_module_global_var_hard_regs(_i,*(MIR_module_t_conflict *)(ctx->error_func + 8));
  bVar13 = *(uint *)&ctx->c2mir_ctx < 2;
  bm_00 = *(bitmap_t *)((long)ctx[1].environment_module.data + 0x170);
  bm_01 = (const_bitmap_t)(ctx->environment_module).name;
  ctx[1].temp_ops = (VARR_MIR_op_t *)0x0;
  prVar6 = VARR_reg_info_taddr(*(VARR_reg_info_t **)((long)ctx->setjmp_addr + 8));
  *(reg_info_t **)((long)ctx[1].environment_module.data + 0x178) = prVar6;
  VARR_MIR_reg_ttrunc(*(VARR_MIR_reg_t **)((long)ctx[1].environment_module.data + 8),0);
  for (var = 0; var <= (uint)slots_num; var = var + 1) {
    VARR_MIR_reg_tpush(*(VARR_MIR_reg_t **)((long)ctx[1].environment_module.data + 8),0xffffffff);
  }
  VARR_allocno_info_ttrunc(*(VARR_allocno_info_t **)((long)ctx[1].environment_module.data + 0x10),0)
  ;
  prVar6 = *(reg_info_t **)((long)ctx[1].environment_module.data + 0x178);
  *(undefined4 *)ctx[1].environment_module.data = 0x22;
  for (max_var = 0x22; MVar5 = max_var, max_var <= (uint)slots_num; max_var = max_var + 1) {
    iVar3 = bitmap_bit_p((const_bitmap_t)ctx->temp_data,(ulong)max_var);
    iVar4 = bitmap_bit_p((const_bitmap_t)ctx->used_label_p,(ulong)max_var);
    if (iVar4 == 0) {
      aVar15.tied_reg_p = iVar3;
      aVar15.reg = MVar5;
      aVar15.reg_infos = prVar6;
      VARR_allocno_info_tpush
                (*(VARR_allocno_info_t **)((long)ctx[1].environment_module.data + 0x10),aVar15);
      used_locs_addr = (bitmap_t *)0x0;
      for (bm = (bitmap_t)
                VARR_live_range_tget
                          ((VARR_live_range_t *)ctx[1].used_label_p[3].varr,(ulong)max_var);
          bm != (bitmap_t)0x0; bm = (bitmap_t)bm[1].els_num) {
        used_locs_addr =
             (bitmap_t *)
             ((long)((*(int *)((long)&bm->size + 4) - (int)bm->size) + 1) + (long)used_locs_addr);
      }
      *(bitmap_t **)
       (*(long *)((long)ctx[1].environment_module.data + 0x178) + (ulong)max_var * 0x10 + 8) =
           used_locs_addr;
    }
    else {
      j = MIR_reg_type((MIR_context_t)ctx->gen_ctx,max_var - 0x21,func_00);
      reg = get_new_stack_slot((gen_ctx_t)ctx,j,&k);
      VARR_MIR_reg_tset(*(VARR_MIR_reg_t **)((long)ctx[1].environment_module.data + 8),
                        (ulong)max_var,reg);
      *(MIR_reg_t *)ctx[1].environment_module.data = reg + k;
      if ((*(long *)&ctx->func_redef_permission_p != 0) && (1 < *(int *)&ctx->insn_nops)) {
        pFVar1 = *(FILE **)&ctx->func_redef_permission_p;
        pcVar7 = MIR_reg_name((MIR_context_t)ctx->gen_ctx,max_var - 0x21,func_00);
        fprintf(pFVar1," Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar7,
                (ulong)max_var,
                *(undefined8 *)
                 (*(long *)((long)ctx[1].environment_module.data + 0x178) + (ulong)max_var * 0x10),
                (ulong)reg);
      }
    }
  }
  local_bc = 0;
  while( true ) {
    bVar2 = false;
    if (local_bc <= *(int *)&ctx[1].used_label_p[1].varr) {
      sVar8 = VARR_bitmap_tlength(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x18));
      bVar2 = local_bc < (int)sVar8;
    }
    if (!bVar2) break;
    if (src == (const_bitmap_t)0x0) {
      pVVar9 = VARR_bitmap_tget(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x18),
                                (long)local_bc);
      bitmap_clear(pVVar9);
      if (!bVar13) {
        pVVar9 = VARR_bitmap_tget(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x20),
                                  (long)local_bc);
        bitmap_clear(pVVar9);
      }
    }
    else {
      pVVar9 = VARR_bitmap_tget(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x18),
                                (long)local_bc);
      bitmap_copy(pVVar9,src);
      if (!bVar13) {
        pVVar9 = VARR_bitmap_tget(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x20),
                                  (long)local_bc);
        bitmap_copy(pVVar9,src);
      }
    }
    local_bc = local_bc + 1;
  }
  while (sVar8 = VARR_bitmap_tlength(*(VARR_bitmap_t **)
                                      ((long)ctx[1].environment_module.data + 0x18)),
        (int)sVar8 <= *(int *)&ctx[1].used_label_p[1].varr) {
    pVVar9 = bitmap_create2(0x22);
    if (src != (const_bitmap_t)0x0) {
      bitmap_copy(pVVar9,src);
    }
    VARR_bitmap_tpush(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x18),pVVar9);
    if (!bVar13) {
      pVVar9 = bitmap_create2(0x22);
      if (src != (const_bitmap_t)0x0) {
        bitmap_copy(pVVar9,src);
      }
      VARR_bitmap_tpush(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x20),pVVar9);
    }
  }
  sVar8 = VARR_allocno_info_tlength
                    (*(VARR_allocno_info_t **)((long)ctx[1].environment_module.data + 0x10));
  __base = VARR_allocno_info_taddr
                     (*(VARR_allocno_info_t **)((long)ctx[1].environment_module.data + 0x10));
  qsort(__base,(long)(int)sVar8,0x10,allocno_info_compare_func);
  ppVVar10 = VARR_bitmap_taddr(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x18));
  ppVVar11 = VARR_bitmap_taddr(*(VARR_bitmap_t **)((long)ctx[1].environment_module.data + 0x20));
  for (var = 0; var < 0x22; var = var + 1) {
    for (bm = (bitmap_t)
              VARR_live_range_tget((VARR_live_range_t *)ctx[1].used_label_p[3].varr,(ulong)var);
        bm != (bitmap_t)0x0; bm = (bitmap_t)bm[1].els_num) {
      for (simple_loc_update_p = (int)bm->size; simple_loc_update_p <= *(int *)((long)&bm->size + 4)
          ; simple_loc_update_p = simple_loc_update_p + 1) {
        bitmap_set_bit_p(ppVVar10[simple_loc_update_p],(ulong)var);
        if (!bVar13) {
          bitmap_set_bit_p(ppVVar11[simple_loc_update_p],(ulong)var);
        }
      }
    }
  }
  bitmap_clear((bitmap_t)ctx->interp_ctx);
  if (!bVar13) {
    HTAB_lr_gap_t_clear(*(HTAB_lr_gap_t **)((long)ctx[1].environment_module.data + 0x150));
  }
  local_c0 = 0;
  do {
    if ((int)sVar8 <= local_c0) {
      return;
    }
    aVar15 = VARR_allocno_info_tget
                       (*(VARR_allocno_info_t **)((long)ctx[1].environment_module.data + 0x10),
                        (long)local_c0);
    local_d0 = aVar15.reg;
    max_var = local_d0;
    MVar5 = VARR_MIR_reg_tget(*(VARR_MIR_reg_t **)((long)ctx[1].environment_module.data + 8),
                              (ulong)local_d0);
    if (MVar5 == 0xffffffff) {
      j = MIR_reg_type((MIR_context_t)ctx->gen_ctx,max_var - 0x21,func_00);
      aVar15 = VARR_allocno_info_tget
                         (*(VARR_allocno_info_t **)((long)ctx[1].environment_module.data + 0x10),
                          (long)local_c0);
      hard_reg_name._4_4_ = aVar15.tied_reg_p;
      if (hard_reg_name._4_4_ == 0) {
        type = max_var;
        start_lr_00 = VARR_live_range_tget
                                ((VARR_live_range_t *)ctx[1].used_label_p[3].varr,(ulong)max_var);
        if (start_lr_00 != (live_range_t_conflict)0x0) {
          bitmap_clear(bm_00);
          for (bm = (bitmap_t)start_lr_00; bm != (bitmap_t)0x0; bm = (bitmap_t)bm[1].els_num) {
            for (simple_loc_update_p = (int)bm->size;
                simple_loc_update_p <= *(int *)((long)&bm->size + 4);
                simple_loc_update_p = simple_loc_update_p + 1) {
              bitmap_ior(bm_00,bm_00,ppVVar10[simple_loc_update_p]);
            }
          }
          pcStack_a0 = "";
          VARR_lr_gap_ttrunc(*(VARR_lr_gap_t **)((long)ctx[1].environment_module.data + 0x30),0);
          reg = get_hard_reg((gen_ctx_t)ctx,j,bm_00);
          if (reg == 0xffffffff) {
            MVar5 = 0xffffffff;
            if ((bVar13) ||
               (reg = get_hard_reg_with_split((gen_ctx_t)ctx,max_var,j,start_lr_00), MVar5 = reg,
               reg == 0xffffffff)) {
              reg = MVar5;
              reg = get_stack_loc((gen_ctx_t)ctx,*ctx[1].environment_module.data,j,bm_00,&k);
            }
            else {
              setup_used_hard_regs((gen_ctx_t)ctx,j,reg);
              pcStack_a0 = "(with splitting live ranges)";
            }
          }
          else {
            setup_used_hard_regs((gen_ctx_t)ctx,j,reg);
          }
          if ((*(long *)&ctx->func_redef_permission_p != 0) && (1 < *(int *)&ctx->insn_nops)) {
            pFVar1 = *(FILE **)&ctx->func_redef_permission_p;
            pcVar7 = MIR_reg_name((MIR_context_t)ctx->gen_ctx,max_var - 0x21,func_00);
            in_stack_fffffffffffffea8 = (ulong)reg;
            fprintf(pFVar1," Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n",pcStack_a0,pcVar7,
                    (ulong)max_var,
                    *(undefined8 *)
                     (*(long *)((long)ctx[1].environment_module.data + 0x178) +
                     (ulong)max_var * 0x10),in_stack_fffffffffffffea8);
            fprintf(*(FILE **)&ctx->func_redef_permission_p,"  live range: ");
            print_live_ranges((gen_ctx_t)ctx,start_lr_00);
          }
          bitmap_clear(bm_01);
          while (sVar12 = VARR_lr_gap_tlength(*(VARR_lr_gap_t **)
                                               ((long)ctx[1].environment_module.data + 0x30)),
                sVar12 != 0) {
            lVar16 = VARR_lr_gap_tpop(*(VARR_lr_gap_t **)
                                       ((long)ctx[1].environment_module.data + 0x30));
            lr_bb._0_2_ = lVar16.hreg;
            lr_bb._4_4_ = lVar16.reg;
            lr_gap._0_8_ = lVar16.lr;
            if ((*(long *)&ctx->func_redef_permission_p != 0) && (3 < *(int *)&ctx->insn_nops)) {
              pcVar7 = "";
              if (lr_bb._4_4_ == max_var) {
                pcVar7 = "*";
              }
              in_stack_fffffffffffffea8 =
                   CONCAT44((int)(in_stack_fffffffffffffea8 >> 0x20),
                            *(undefined4 *)(lr_gap._0_8_ + 0xc));
              fprintf(*(FILE **)&ctx->func_redef_permission_p,
                      "   Splitting lr gap: r%d%s, h%d [%d..%d]\n",(ulong)lr_bb._4_4_,pcVar7,
                      (ulong)(uint)(int)(short)lr_bb,(ulong)*(uint *)(lr_gap._0_8_ + 8),
                      in_stack_fffffffffffffea8);
            }
            for (_hr = *(long **)lr_gap._0_8_; _hr != (long *)0x0; _hr = (long *)_hr[1]) {
              bitmap_set_bit_p(*(bitmap_t *)(*_hr + 0x78),(ulong)lr_bb._4_4_);
            }
            if (lr_bb._4_4_ == max_var) {
              bitmap_set_bit_p(bm_01,(long)*(int *)(lr_gap._0_8_ + 8));
            }
            else {
              lr_bb._2_2_ = lVar16.type;
              k = target_locs_num((int)(short)lr_bb,(int)lr_bb._2_2_);
              for (reserve_p = 0; reserve_p < k; reserve_p = reserve_p + 1) {
                MVar5 = target_nth_loc((int)(short)lr_bb,(int)lr_bb._2_2_,reserve_p);
                delete_lr_gap((gen_ctx_t)ctx,MVar5,(live_range_t_conflict)lr_gap._0_8_);
                for (simple_loc_update_p = *(int *)(lr_gap._0_8_ + 8);
                    simple_loc_update_p <= *(int *)(lr_gap._0_8_ + 0xc);
                    simple_loc_update_p = simple_loc_update_p + 1) {
                  bitmap_clear_bit_p(ppVVar10[simple_loc_update_p],(ulong)MVar5);
                }
              }
            }
          }
          VARR_MIR_reg_tset(*(VARR_MIR_reg_t **)((long)ctx[1].environment_module.data + 8),
                            (ulong)max_var,reg);
          k = target_locs_num(reg,j);
          bVar2 = reg < 0x22;
          for (bm = (bitmap_t)
                    VARR_live_range_tget
                              ((VARR_live_range_t *)ctx[1].used_label_p[3].varr,(ulong)type);
              bm != (bitmap_t)0x0; bm = (bitmap_t)bm[1].els_num) {
            bVar14 = true;
            if (!bVar13 && bVar2) {
              iVar3 = bitmap_bit_p(bm_01,(long)(int)bm->size);
              bVar14 = iVar3 == 0;
            }
            if (bVar14) {
              for (simple_loc_update_p = (int)bm->size;
                  simple_loc_update_p <= *(int *)((long)&bm->size + 4);
                  simple_loc_update_p = simple_loc_update_p + 1) {
                for (reserve_p = 0; reserve_p < k; reserve_p = reserve_p + 1) {
                  pVVar9 = ppVVar10[simple_loc_update_p];
                  MVar5 = target_nth_loc(reg,j,reserve_p);
                  bitmap_set_bit_p(pVVar9,(ulong)MVar5);
                }
              }
            }
            if (!bVar13 && bVar2) {
              if (bm->els_num == 0) {
                for (simple_loc_update_p = (int)bm->size;
                    simple_loc_update_p <= *(int *)((long)&bm->size + 4);
                    simple_loc_update_p = simple_loc_update_p + 1) {
                  for (reserve_p = 0; reserve_p < k; reserve_p = reserve_p + 1) {
                    pVVar9 = ppVVar11[simple_loc_update_p];
                    MVar5 = target_nth_loc(reg,j,reserve_p);
                    bitmap_set_bit_p(pVVar9,(ulong)MVar5);
                  }
                }
              }
              else if (bVar14) {
                for (reserve_p = 0; reserve_p < k; reserve_p = reserve_p + 1) {
                  MVar5 = target_nth_loc(reg,j,reserve_p);
                  if ((*(long *)&ctx->func_redef_permission_p != 0) && (3 < *(int *)&ctx->insn_nops)
                     ) {
                    fprintf(*(FILE **)&ctx->func_redef_permission_p,
                            "    Adding lr gap: r%d, h%d [%d..%d]\n",(ulong)max_var,(ulong)MVar5,
                            (ulong)(uint)bm->size,(ulong)*(uint *)((long)&bm->size + 4));
                  }
                  insert_lr_gap((gen_ctx_t)ctx,MVar5,j,max_var,(live_range_t_conflict)bm);
                }
              }
            }
          }
        }
      }
      else {
        pcVar7 = MIR_reg_hard_reg_name(_i,max_var - 0x21,func_00);
        MVar5 = _MIR_get_hard_reg(_i,pcVar7);
        if ((((int)MVar5 < 0) || (0x21 < (int)MVar5)) ||
           (iVar3 = target_locs_num(MVar5,j), iVar3 != 1)) {
          __assert_fail("hard_reg >= 0 && hard_reg <= ST1_HARD_REG && target_locs_num (hard_reg, type) == 1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1dac,"void assign(gen_ctx_t)");
        }
        VARR_MIR_reg_tset(*(VARR_MIR_reg_t **)((long)ctx[1].environment_module.data + 8),
                          (ulong)max_var,MVar5);
        for (bm = (bitmap_t)
                  VARR_live_range_tget
                            ((VARR_live_range_t *)ctx[1].used_label_p[3].varr,(ulong)max_var);
            bm != (bitmap_t)0x0; bm = (bitmap_t)bm[1].els_num) {
          for (simple_loc_update_p = (int)bm->size;
              simple_loc_update_p <= *(int *)((long)&bm->size + 4);
              simple_loc_update_p = simple_loc_update_p + 1) {
            iVar3 = bitmap_bit_p(ppVVar10[simple_loc_update_p],(long)(int)MVar5);
            if (iVar3 == 0) {
              __assert_fail("bitmap_bit_p (used_locs_addr[j], hard_reg)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1db1,"void assign(gen_ctx_t)");
            }
          }
        }
        if (pcVar7 == (char *)0x0) {
          setup_used_hard_regs((gen_ctx_t)ctx,j,MVar5);
        }
        if ((*(long *)&ctx->func_redef_permission_p != 0) && (1 < *(int *)&ctx->insn_nops)) {
          pFVar1 = *(FILE **)&ctx->func_redef_permission_p;
          pcVar7 = MIR_reg_name((MIR_context_t)ctx->gen_ctx,max_var - 0x21,func_00);
          fprintf(pFVar1," Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar7,
                  (ulong)max_var,
                  *(undefined8 *)
                   (*(long *)((long)ctx[1].environment_module.data + 0x178) + (ulong)max_var * 0x10)
                  ,(long)(int)MVar5);
        }
      }
    }
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

static void assign (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t best_loc, i, reg, var, max_var = get_max_var (gen_ctx);
  MIR_type_t type;
  int slots_num;
  int j, k, simple_loc_update_p, reserve_p, nregs;
  live_range_t start_lr, lr;
  bitmap_t bm;
  size_t length;
  bitmap_t *used_locs_addr, *busy_used_locs_addr;
  allocno_info_t allocno_info;
  MIR_func_t func = curr_func_item->u.func;
  bitmap_t global_hard_regs = _MIR_get_module_global_var_hard_regs (ctx, curr_func_item->module);
  const char *msg;
  const int simplified_p = ONLY_SIMPLIFIED_RA || optimize_level < 2;
  bitmap_t conflict_locs = conflict_locs1, spill_lr_starts = temp_bitmap2;

  func_stack_slots_num = 0;
  curr_reg_infos = VARR_ADDR (reg_info_t, curr_cfg->reg_info);
  VARR_TRUNC (MIR_reg_t, reg_renumber, 0);
  for (i = 0; i <= max_var; i++) {
    VARR_PUSH (MIR_reg_t, reg_renumber, MIR_NON_VAR);
  }
  /* max_var for func */
  VARR_TRUNC (allocno_info_t, sorted_regs, 0);
  allocno_info.reg_infos = curr_reg_infos;
  start_mem_loc = MAX_HARD_REG + 1;
  for (reg = MAX_HARD_REG + 1; reg <= max_var; reg++) {
    allocno_info.reg = reg;
    allocno_info.tied_reg_p = bitmap_bit_p (tied_regs, reg);
    if (bitmap_bit_p (addr_regs, reg)) {
      type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, func);
      best_loc = get_new_stack_slot (gen_ctx, type, &slots_num);
      VARR_SET (MIR_reg_t, reg_renumber, reg, best_loc);
      start_mem_loc = best_loc + slots_num;
      DEBUG (2, {
        fprintf (debug_file, " Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",
                 MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg,
                 curr_reg_infos[reg].freq, (unsigned long) best_loc);
      });
      continue;
    }
    VARR_PUSH (allocno_info_t, sorted_regs, allocno_info);
    for (length = 0, lr = VARR_GET (live_range_t, var_live_ranges, reg); lr != NULL; lr = lr->next)
      length += lr->finish - lr->start + 1;
    curr_reg_infos[reg].live_length = length;
  }
  for (int n = 0; n <= curr_point && n < (int) VARR_LENGTH (bitmap_t, used_locs); n++)
    if (global_hard_regs == NULL) {
      bitmap_clear (VARR_GET (bitmap_t, used_locs, n));
      if (!simplified_p) bitmap_clear (VARR_GET (bitmap_t, busy_used_locs, n));
    } else {
      bitmap_copy (VARR_GET (bitmap_t, used_locs, n), global_hard_regs);
      if (!simplified_p) bitmap_copy (VARR_GET (bitmap_t, busy_used_locs, n), global_hard_regs);
    }
  while ((int) VARR_LENGTH (bitmap_t, used_locs) <= curr_point) {
    bm = bitmap_create2 (MAX_HARD_REG + 1);
    if (global_hard_regs != NULL) bitmap_copy (bm, global_hard_regs);
    VARR_PUSH (bitmap_t, used_locs, bm);
    if (!simplified_p) {
      bm = bitmap_create2 (MAX_HARD_REG + 1);
      if (global_hard_regs != NULL) bitmap_copy (bm, global_hard_regs);
      VARR_PUSH (bitmap_t, busy_used_locs, bm);
    }
  }
  nregs = (int) VARR_LENGTH (allocno_info_t, sorted_regs);
  qsort (VARR_ADDR (allocno_info_t, sorted_regs), nregs, sizeof (allocno_info_t),
         allocno_info_compare_func);
  used_locs_addr = VARR_ADDR (bitmap_t, used_locs);
  busy_used_locs_addr = VARR_ADDR (bitmap_t, busy_used_locs);
  /* Mark ranges used by hard regs for pseudo reg splitting: */
  for (i = 0; i <= MAX_HARD_REG; i++) {
    for (lr = VARR_GET (live_range_t, var_live_ranges, i); lr != NULL; lr = lr->next)
      for (j = lr->start; j <= lr->finish; j++) {
        bitmap_set_bit_p (used_locs_addr[j], i);
        if (!simplified_p) bitmap_set_bit_p (busy_used_locs_addr[j], i);
      }
  }
  bitmap_clear (func_used_hard_regs);
  if (!simplified_p) HTAB_CLEAR (lr_gap_t, lr_gap_tab);
  for (int n = 0; n < nregs; n++) { /* hard reg and stack slot assignment */
    reg = VARR_GET (allocno_info_t, sorted_regs, n).reg;
    if (VARR_GET (MIR_reg_t, reg_renumber, reg) != MIR_NON_VAR) continue;
    type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, func);
    if (VARR_GET (allocno_info_t, sorted_regs, n).tied_reg_p) {
      const char *hard_reg_name = MIR_reg_hard_reg_name (ctx, reg - MAX_HARD_REG, func);
      int hard_reg = _MIR_get_hard_reg (ctx, hard_reg_name);
      gen_assert (hard_reg >= 0 && hard_reg <= MAX_HARD_REG
                  && target_locs_num (hard_reg, type) == 1);
      VARR_SET (MIR_reg_t, reg_renumber, reg, hard_reg);
#ifndef NDEBUG
      for (lr = VARR_GET (live_range_t, var_live_ranges, reg); lr != NULL; lr = lr->next)
        for (j = lr->start; j <= lr->finish; j++)
          gen_assert (bitmap_bit_p (used_locs_addr[j], hard_reg));
#endif
      if (hard_reg_name == NULL) setup_used_hard_regs (gen_ctx, type, hard_reg);
      DEBUG (2, {
        fprintf (debug_file, " Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",
                 MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg,
                 curr_reg_infos[reg].freq, (unsigned long) hard_reg);
      });
      continue;
    }
    var = reg;
    if ((start_lr = VARR_GET (live_range_t, var_live_ranges, var)) == NULL) continue;
    bitmap_clear (conflict_locs);
    for (lr = start_lr; lr != NULL; lr = lr->next) {
      for (j = lr->start; j <= lr->finish; j++)
        bitmap_ior (conflict_locs, conflict_locs, used_locs_addr[j]);
    }
    msg = "";
    VARR_TRUNC (lr_gap_t, spill_gaps, 0);
    if ((best_loc = get_hard_reg (gen_ctx, type, conflict_locs)) != MIR_NON_VAR) {
      setup_used_hard_regs (gen_ctx, type, best_loc);
    } else if (!simplified_p
               && ((best_loc = get_hard_reg_with_split (gen_ctx, reg, type, start_lr))
                   != MIR_NON_VAR)) {
      /* try to use gaps in already allocated pseudos or given pseudo: */
      setup_used_hard_regs (gen_ctx, type, best_loc);
      msg = "(with splitting live ranges)";
    } else {
      best_loc = get_stack_loc (gen_ctx, start_mem_loc, type, conflict_locs, &slots_num);
    }
    DEBUG (2, {
      fprintf (debug_file, " Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n", msg,
               MIR_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, func), reg, curr_reg_infos[reg].freq,
               (unsigned long) best_loc);
      fprintf (debug_file, "  live range: ");
      print_live_ranges (gen_ctx, start_lr);
    });
    bitmap_clear (spill_lr_starts);
    while (VARR_LENGTH (lr_gap_t, spill_gaps) != 0) {
      lr_gap_t lr_gap = VARR_POP (lr_gap_t, spill_gaps);
      DEBUG (4, {
        fprintf (debug_file, "   Splitting lr gap: r%d%s, h%d [%d..%d]\n", lr_gap.reg,
                 lr_gap.reg == reg ? "*" : "", lr_gap.hreg, lr_gap.lr->start, lr_gap.lr->finish);
      });
      for (lr_bb_t lr_bb = lr_gap.lr->lr_bb; lr_bb != NULL; lr_bb = lr_bb->next)
        bitmap_set_bit_p (lr_bb->bb->spill_gen, lr_gap.reg);
      if (lr_gap.reg == reg) {
        bitmap_set_bit_p (spill_lr_starts, lr_gap.lr->start);
        continue; /* spilled gap of the current reg */
      }
      slots_num = target_locs_num (lr_gap.hreg, lr_gap.type);
      for (k = 0; k < slots_num; k++) {
        MIR_reg_t curr_hr = target_nth_loc (lr_gap.hreg, lr_gap.type, k);
        delete_lr_gap (gen_ctx, curr_hr, lr_gap.lr);
        for (j = lr_gap.lr->start; j <= lr_gap.lr->finish; j++)
          bitmap_clear_bit_p (used_locs_addr[j], curr_hr);
      }
    }
    VARR_SET (MIR_reg_t, reg_renumber, reg, best_loc);
    slots_num = target_locs_num (best_loc, type);
    simple_loc_update_p = simplified_p || best_loc > MAX_HARD_REG;
    for (lr = VARR_GET (live_range_t, var_live_ranges, var); lr != NULL; lr = lr->next) {
      if ((reserve_p = simple_loc_update_p || !bitmap_bit_p (spill_lr_starts, lr->start))) {
        for (j = lr->start; j <= lr->finish; j++)
          for (k = 0; k < slots_num; k++)
            bitmap_set_bit_p (used_locs_addr[j], target_nth_loc (best_loc, type, k));
      }
      if (simple_loc_update_p) continue;
      if (lr->lr_bb == NULL) {
        for (j = lr->start; j <= lr->finish; j++)
          for (k = 0; k < slots_num; k++)
            bitmap_set_bit_p (busy_used_locs_addr[j], target_nth_loc (best_loc, type, k));
      } else if (reserve_p) {
        for (k = 0; k < slots_num; k++) {
          MIR_reg_t hr = target_nth_loc (best_loc, type, k);
          DEBUG (4, {
            fprintf (debug_file, "    Adding lr gap: r%d, h%d [%d..%d]\n", reg, hr, lr->start,
                     lr->finish);
          });
          insert_lr_gap (gen_ctx, hr, type, reg, lr);
        }
      }
    }
  }
}